

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O3

void * __thiscall
xercesc_4_0::DOMDocumentImpl::setUserData
          (DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key,void *data,DOMUserDataHandler *handler)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  MemoryManager *pMVar2;
  bool bVar3;
  uint key2;
  int iVar4;
  ulong uVar5;
  RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
  *pRVar6;
  RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  *pRVar7;
  undefined4 extraout_var;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *valueToAdopt;
  XMLCh *pXVar8;
  XMLCh XVar9;
  void *pvVar10;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar11;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  enumKeys;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  local_68;
  
  pRVar1 = (this->fUserDataTableKeys).fHashTable;
  if ((key == (XMLCh *)0x0) || (uVar5 = (ulong)(ushort)*key, uVar5 == 0)) {
    uVar5 = 0;
  }
  else {
    XVar9 = key[1];
    if (XVar9 != L'\0') {
      pXVar8 = key + 2;
      do {
        uVar5 = (ulong)(ushort)XVar9 + (uVar5 >> 0x18) + uVar5 * 0x26;
        XVar9 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar9 != L'\0');
    }
    uVar5 = uVar5 % pRVar1->fHashModulus;
  }
  pRVar11 = pRVar1->fBucketList[uVar5];
  if (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,key,pRVar11->fKey);
      if (bVar3) {
        if (pRVar11->fData != (PoolElem *)0x0) {
          key2 = pRVar11->fData->fId;
          goto LAB_00264a64;
        }
        break;
      }
      pRVar11 = pRVar11->fNext;
    } while (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  key2 = XMLStringPool::addNewEntry(&this->fUserDataTableKeys,key);
LAB_00264a64:
  pRVar7 = this->fUserDataTable;
  if (pRVar7 == (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                 *)0x0) {
    pRVar7 = (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
              *)XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar2 = this->fMemoryManager;
    pRVar7->fMemoryManager = pMVar2;
    pRVar7->fAdoptedElems = true;
    pRVar7->fBucketList =
         (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
          **)0x0;
    pRVar7->fHashModulus = 0x6d;
    pRVar7->fCount = 0;
    iVar4 = (*pMVar2->_vptr_MemoryManager[3])();
    pRVar7->fBucketList =
         (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
          **)CONCAT44(extraout_var,iVar4);
    pvVar10 = (void *)0x0;
    memset((RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
            **)CONCAT44(extraout_var,iVar4),0,pRVar7->fHashModulus << 3);
    this->fUserDataTable = pRVar7;
  }
  else {
    pvVar10 = (void *)0x0;
    pRVar6 = pRVar7->fBucketList[(ulong)n % pRVar7->fHashModulus];
    if (pRVar6 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                   *)0x0) {
      pvVar10 = (void *)0x0;
      do {
        if ((pRVar6->fKey2 == key2) && ((DOMNodeImpl *)pRVar6->fKey1 == n)) {
          if (pRVar6->fData == (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0) {
            pvVar10 = (void *)0x0;
          }
          else {
            pvVar10 = pRVar6->fData->fKey;
            RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
            ::removeKey(pRVar7,n,key2);
          }
          break;
        }
        pRVar6 = pRVar6->fNext;
      } while (pRVar6 != (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
                          *)0x0);
    }
  }
  if (data == (void *)0x0) {
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOfEnumerator(&local_68,this->fUserDataTable,false,this->fMemoryManager);
    local_68.fLockPrimaryKey = n;
    (*local_68.super_XMLEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>.
      _vptr_XMLEnumerator[4])(&local_68);
    if ((local_68.fCurElem ==
         (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
          *)0x0) && (local_68.fCurHash == (local_68.fToEnum)->fHashModulus)) {
      n->flags = n->flags & 0xfdff;
    }
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOfEnumerator(&local_68);
  }
  else {
    pRVar7 = this->fUserDataTable;
    valueToAdopt = (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)
                   XMemory::operator_new(0x10,this->fMemoryManager);
    valueToAdopt->fKey = data;
    valueToAdopt->fValue = handler;
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::put(pRVar7,n,key2,valueToAdopt);
  }
  return pvVar10;
}

Assistant:

void* DOMDocumentImpl::setUserData(DOMNodeImpl* n, const XMLCh* key, void* data, DOMUserDataHandler* handler)
{
    void* oldData = 0;
    unsigned int keyId=fUserDataTableKeys.addOrFind(key);

    if (!fUserDataTable) {
        // create the table on heap so that it can be cleaned in destructor
        fUserDataTable = new (fMemoryManager) RefHash2KeysTableOf<DOMUserDataRecord, PtrHasher>
        (
            109
            , true
            , fMemoryManager
        );
    }
    else {
        DOMUserDataRecord* oldDataRecord = fUserDataTable->get((void*)n, keyId);

        if (oldDataRecord) {
            oldData = oldDataRecord->getKey();
            fUserDataTable->removeKey((void*)n, keyId);
        }
    }

    if (data) {

        // clone the key first, and create the DOMUserDataRecord
        // create on the heap and adopted by the hashtable which will delete it upon removal.
        fUserDataTable->put((void*)n, keyId, new (fMemoryManager) DOMUserDataRecord(data, handler));
    }
    else {
        RefHash2KeysTableOfEnumerator<DOMUserDataRecord, PtrHasher> enumKeys(fUserDataTable, false, fMemoryManager);
        enumKeys.setPrimaryKey(n);
        if (!enumKeys.hasMoreElements())
            n->hasUserData(false);
    }

    return oldData;
}